

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O0

int uv__inotify_fork(uv_loop_t *loop,void *old_watchers)

{
  QUEUE *papvVar1;
  int iVar2;
  uv_fs_event_t *handle_00;
  char *pcVar3;
  bool bVar4;
  QUEUE *q_2;
  QUEUE *q_1;
  char *tmp_path;
  uv_fs_event_t *handle;
  QUEUE *q;
  QUEUE queue;
  watcher_list tmp_watcher_list;
  watcher_list *watcher_list;
  watcher_list *tmp_watcher_list_iter;
  watcher_root wStack_20;
  int err;
  void *old_watchers_local;
  uv_loop_t *loop_local;
  
  if (old_watchers == (void *)0x0) {
LAB_00a18ec3:
    loop_local._4_4_ = 0;
  }
  else {
    loop->inotify_watchers = old_watchers;
    tmp_watcher_list.entry._24_8_ = &tmp_watcher_list.entry.rbe_color;
    tmp_watcher_list.watchers[0] = &tmp_watcher_list.entry.rbe_color;
    wStack_20.rbh_root = (watcher_list *)old_watchers;
    old_watchers_local = loop;
    tmp_watcher_list._64_8_ = watcher_root_RB_MINMAX(&stack0xffffffffffffffe0,-1);
    while( true ) {
      bVar4 = false;
      if (tmp_watcher_list._64_8_ != 0) {
        watcher_list = watcher_root_RB_NEXT((watcher_list *)tmp_watcher_list._64_8_);
        bVar4 = tmp_watcher_list._64_8_ != 0;
      }
      q = (QUEUE *)tmp_watcher_list.entry._24_8_;
      if (!bVar4) break;
      *(undefined4 *)(tmp_watcher_list._64_8_ + 0x30) = 1;
      if (tmp_watcher_list._64_8_ + 0x20 == *(long *)(tmp_watcher_list._64_8_ + 0x20)) {
        q = (QUEUE *)&q;
        queue[0] = &q;
      }
      else {
        q = *(QUEUE **)(tmp_watcher_list._64_8_ + 0x20);
        queue[0] = *(void **)(tmp_watcher_list._64_8_ + 0x28);
        *(QUEUE ***)queue[0] = &q;
        *(void **)(tmp_watcher_list._64_8_ + 0x28) = (*q)[1];
        **(long **)(tmp_watcher_list._64_8_ + 0x28) = tmp_watcher_list._64_8_ + 0x20;
        (*q)[1] = &q;
      }
      while (papvVar1 = q, (QUEUE *)&q != q) {
        handle_00 = (uv_fs_event_t *)(q + -7);
        pcVar3 = uv__strdup((char *)q[-1][0]);
        if (pcVar3 == (char *)0x0) {
          __assert_fail("tmp_path != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                        ,0x94,"int uv__inotify_fork(uv_loop_t *, void *)");
        }
        *(void **)(*papvVar1)[1] = (*papvVar1)[0];
        *(void **)((long)(*papvVar1)[0] + 8) = (*papvVar1)[1];
        (*papvVar1)[0] = (void *)(tmp_watcher_list._64_8_ + 0x20);
        (*papvVar1)[1] = *(void **)(tmp_watcher_list._64_8_ + 0x28);
        *(QUEUE **)(*papvVar1)[1] = papvVar1;
        *(QUEUE **)(tmp_watcher_list._64_8_ + 0x28) = papvVar1;
        uv_fs_event_stop(handle_00);
        (*papvVar1)[0] = &tmp_watcher_list.entry.rbe_color;
        (*papvVar1)[1] = tmp_watcher_list.watchers[0];
        *(QUEUE **)(*papvVar1)[1] = papvVar1;
        tmp_watcher_list.watchers[0] = papvVar1;
        papvVar1[-1][0] = pcVar3;
      }
      *(undefined4 *)(tmp_watcher_list._64_8_ + 0x30) = 0;
      maybe_free_watcher_list
                ((watcher_list *)tmp_watcher_list._64_8_,(uv_loop_t *)old_watchers_local);
      tmp_watcher_list._64_8_ = watcher_list;
    }
    if (&tmp_watcher_list.entry.rbe_color == (int *)tmp_watcher_list.entry._24_8_) {
      q = (QUEUE *)&q;
      queue[0] = &q;
    }
    else {
      queue[0] = tmp_watcher_list.watchers[0];
      *(QUEUE ***)tmp_watcher_list.watchers[0] = &q;
      tmp_watcher_list.watchers[0] = *(void **)((long)q + 8);
      *(int **)tmp_watcher_list.watchers[0] = &tmp_watcher_list.entry.rbe_color;
      *(QUEUE ***)((long)q + 8) = &q;
    }
    do {
      if ((QUEUE *)&q == q) goto LAB_00a18ec3;
      *(void **)(*q)[1] = (*q)[0];
      *(void **)((long)(*q)[0] + 8) = (*q)[1];
      pcVar3 = (char *)q[-1][0];
      q[-1][0] = (void *)0x0;
      iVar2 = uv_fs_event_start((uv_fs_event_t *)(q + -7),(uv_fs_event_cb)q[-1][1],pcVar3,0);
      uv__free(pcVar3);
      loop_local._4_4_ = iVar2;
    } while (iVar2 == 0);
  }
  return loop_local._4_4_;
}

Assistant:

int uv__inotify_fork(uv_loop_t* loop, void* old_watchers) {
  /* Open the inotify_fd, and re-arm all the inotify watchers. */
  int err;
  struct watcher_list* tmp_watcher_list_iter;
  struct watcher_list* watcher_list;
  struct watcher_list tmp_watcher_list;
  QUEUE queue;
  QUEUE* q;
  uv_fs_event_t* handle;
  char* tmp_path;

  if (old_watchers != NULL) {
    /* We must restore the old watcher list to be able to close items
     * out of it.
     */
    loop->inotify_watchers = old_watchers;

    QUEUE_INIT(&tmp_watcher_list.watchers);
    /* Note that the queue we use is shared with the start and stop()
     * functions, making QUEUE_FOREACH unsafe to use. So we use the
     * QUEUE_MOVE trick to safely iterate. Also don't free the watcher
     * list until we're done iterating. c.f. uv__inotify_read.
     */
    RB_FOREACH_SAFE(watcher_list, watcher_root,
                    CAST(&old_watchers), tmp_watcher_list_iter) {
      watcher_list->iterating = 1;
      QUEUE_MOVE(&watcher_list->watchers, &queue);
      while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        handle = QUEUE_DATA(q, uv_fs_event_t, watchers);
        /* It's critical to keep a copy of path here, because it
         * will be set to NULL by stop() and then deallocated by
         * maybe_free_watcher_list
         */
        tmp_path = uv__strdup(handle->path);
        assert(tmp_path != NULL);
        QUEUE_REMOVE(q);
        QUEUE_INSERT_TAIL(&watcher_list->watchers, q);
        uv_fs_event_stop(handle);

        QUEUE_INSERT_TAIL(&tmp_watcher_list.watchers, &handle->watchers);
        handle->path = tmp_path;
      }
      watcher_list->iterating = 0;
      maybe_free_watcher_list(watcher_list, loop);
    }

    QUEUE_MOVE(&tmp_watcher_list.watchers, &queue);
    while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        QUEUE_REMOVE(q);
        handle = QUEUE_DATA(q, uv_fs_event_t, watchers);
        tmp_path = handle->path;
        handle->path = NULL;
        err = uv_fs_event_start(handle, handle->cb, tmp_path, 0);
        uv__free(tmp_path);
        if (err)
          return err;
    }
  }

  return 0;
}